

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzCompressInit(bz_stream *strm,int blockSize100k,int verbosity,int workFactor)

{
  int iVar1;
  EState *s_00;
  UInt32 *pUVar2;
  int in_ECX;
  Int32 in_EDX;
  int in_ESI;
  bz_stream *in_RDI;
  EState *s;
  Int32 n;
  Int32 local_1c;
  int local_4;
  
  iVar1 = bz_config_ok();
  if (iVar1 == 0) {
    local_4 = -9;
  }
  else if ((((in_RDI == (bz_stream *)0x0) || (in_ESI < 1)) || (9 < in_ESI)) ||
          ((in_ECX < 0 || (0xfa < in_ECX)))) {
    local_4 = -2;
  }
  else {
    local_1c = in_ECX;
    if (in_ECX == 0) {
      local_1c = 0x1e;
    }
    if (in_RDI->bzalloc == (_func_void_ptr_void_ptr_int_int *)0x0) {
      in_RDI->bzalloc = default_bzalloc;
    }
    if (in_RDI->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
      in_RDI->bzfree = default_bzfree;
    }
    s_00 = (EState *)(*in_RDI->bzalloc)(in_RDI->opaque,0xd9d8,1);
    if (s_00 == (EState *)0x0) {
      local_4 = -3;
    }
    else {
      s_00->strm = in_RDI;
      s_00->arr1 = (UInt32 *)0x0;
      s_00->arr2 = (UInt32 *)0x0;
      s_00->ftab = (UInt32 *)0x0;
      pUVar2 = (UInt32 *)(*in_RDI->bzalloc)(in_RDI->opaque,in_ESI * 400000,1);
      s_00->arr1 = pUVar2;
      pUVar2 = (UInt32 *)(*in_RDI->bzalloc)(in_RDI->opaque,(in_ESI * 100000 + 0x22) * 4,1);
      s_00->arr2 = pUVar2;
      pUVar2 = (UInt32 *)(*in_RDI->bzalloc)(in_RDI->opaque,0x40004,1);
      s_00->ftab = pUVar2;
      if (((s_00->arr1 == (UInt32 *)0x0) || (s_00->arr2 == (UInt32 *)0x0)) ||
         (s_00->ftab == (UInt32 *)0x0)) {
        if (s_00->arr1 != (UInt32 *)0x0) {
          (*in_RDI->bzfree)(in_RDI->opaque,s_00->arr1);
        }
        if (s_00->arr2 != (UInt32 *)0x0) {
          (*in_RDI->bzfree)(in_RDI->opaque,s_00->arr2);
        }
        if (s_00->ftab != (UInt32 *)0x0) {
          (*in_RDI->bzfree)(in_RDI->opaque,s_00->ftab);
        }
        if (s_00 != (EState *)0x0) {
          (*in_RDI->bzfree)(in_RDI->opaque,s_00);
        }
        local_4 = -3;
      }
      else {
        s_00->blockNo = 0;
        s_00->state = 2;
        s_00->mode = 2;
        s_00->combinedCRC = 0;
        s_00->blockSize100k = in_ESI;
        s_00->nblockMAX = in_ESI * 100000 + -0x13;
        s_00->verbosity = in_EDX;
        s_00->workFactor = local_1c;
        s_00->block = (UChar *)s_00->arr2;
        s_00->mtfv = (UInt16 *)s_00->arr1;
        s_00->zbits = (UChar *)0x0;
        s_00->ptr = s_00->arr1;
        in_RDI->state = s_00;
        in_RDI->total_in_lo32 = 0;
        in_RDI->total_in_hi32 = 0;
        in_RDI->total_out_lo32 = 0;
        in_RDI->total_out_hi32 = 0;
        init_RL(s_00);
        prepare_new_block(s_00);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzCompressInit)
                    ( bz_stream* strm,
                     int        blockSize100k,
                     int        verbosity,
                     int        workFactor )
{
   Int32   n;
   EState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL ||
       blockSize100k < 1 || blockSize100k > 9 ||
       workFactor < 0 || workFactor > 250)
     return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(EState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm = strm;

   s->arr1 = NULL;
   s->arr2 = NULL;
   s->ftab = NULL;

   n       = 100000 * blockSize100k;
   s->arr1 = BZALLOC( n                  * sizeof(UInt32) );
   s->arr2 = BZALLOC( (n+BZ_N_OVERSHOOT) * sizeof(UInt32) );
   s->ftab = BZALLOC( 65537              * sizeof(UInt32) );

   if (s->arr1 == NULL || s->arr2 == NULL || s->ftab == NULL) {
      if (s->arr1 != NULL) BZFREE(s->arr1);
      if (s->arr2 != NULL) BZFREE(s->arr2);
      if (s->ftab != NULL) BZFREE(s->ftab);
      if (s       != NULL) BZFREE(s);
      return BZ_MEM_ERROR;
   }

   s->blockNo           = 0;
   s->state             = BZ_S_INPUT;
   s->mode              = BZ_M_RUNNING;
   s->combinedCRC       = 0;
   s->blockSize100k     = blockSize100k;
   s->nblockMAX         = 100000 * blockSize100k - 19;
   s->verbosity         = verbosity;
   s->workFactor        = workFactor;

   s->block             = (UChar*)s->arr2;
   s->mtfv              = (UInt16*)s->arr1;
   s->zbits             = NULL;
   s->ptr               = (UInt32*)s->arr1;

   strm->state          = s;
   strm->total_in_lo32  = 0;
   strm->total_in_hi32  = 0;
   strm->total_out_lo32 = 0;
   strm->total_out_hi32 = 0;
   init_RL ( s );
   prepare_new_block ( s );
   return BZ_OK;
}